

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type * __thiscall
duckdb::Deserializer::
Read<duckdb::vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,true>>
          (Deserializer *this)

{
  ulong uVar1;
  long *in_RSI;
  vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
  *in_RDI;
  idx_t i;
  idx_t size;
  vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
  *vec;
  value_type *in_stack_ffffffffffffff98;
  vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
  *this_00;
  undefined8 local_38;
  Deserializer *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
            *)0xb65caf);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
    Read<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,duckdb::TableFilter>
              (in_stack_ffffffffffffffd8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
    ::push_back(this_00,in_stack_ffffffffffffff98);
    unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               0xb65d0f);
  }
  (**(code **)(*in_RSI + 0x48))();
  return (type *)in_RDI;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}